

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_grp.cpp
# Opt level: O2

FResourceFile * CheckGRP(char *filename,FileReader *file,bool quiet)

{
  int iVar1;
  FResourceFile *this;
  char head [12];
  
  if (0xb < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,head,0xc);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    iVar1 = bcmp(head,"KenSilverman",0xc);
    if (iVar1 != 0) {
      return (FResourceFile *)0x0;
    }
    this = (FResourceFile *)operator_new(0x28);
    FGrpFile::FGrpFile((FGrpFile *)this,filename,file);
    iVar1 = (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
              _vptr_FResourceFile[3])(this,quiet);
    if ((char)iVar1 != '\0') {
      return this;
    }
    this->Reader = (FileReader *)0x0;
    (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile)._vptr_FResourceFile
      [1])(this);
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckGRP(const char *filename, FileReader *file, bool quiet)
{
	char head[12];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 12);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "KenSilverman", 12))
		{
			FResourceFile *rf = new FGrpFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}